

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPAddress.h
# Opt level: O3

void __thiscall jaegertracing::net::IPAddress::print(IPAddress *this,ostream *out)

{
  int iVar1;
  ostream *poVar2;
  string addrStr;
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"{ family=",9);
  iVar1 = 2;
  if (this->_addrLen != 0x10) {
    if (this->_addrLen != 0x1c) {
      __assert_fail("_addrLen == sizeof(::sockaddr_in6)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/IPAddress.h"
                    ,0xb5,"int jaegertracing::net::IPAddress::family() const");
    }
    iVar1 = 10;
  }
  std::ostream::operator<<(out,iVar1);
  host_abi_cxx11_(&local_38,this);
  if (local_38._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,", addr=",7);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_38._M_dataplus._M_p,local_38._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", port=",7);
  iVar1 = port(this);
  poVar2 = (ostream *)std::ostream::operator<<(out,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," }",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void print(std::ostream& out) const
    {
        out << "{ family=" << family();
        const auto addrStr = host();
        if (!addrStr.empty()) {
            out << ", addr=" << addrStr;
        }
        out << ", port=" << port() << " }";
    }